

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_opengl3.cpp
# Opt level: O0

void ImGui_ImplOpenGL3_SetupRenderState
               (ImDrawData *draw_data,int fb_width,int fb_height,GLuint vertex_array_object)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float local_78 [2];
  float ortho_projection [4] [4];
  float B;
  float T;
  float R;
  float L;
  GLuint vertex_array_object_local;
  int fb_height_local;
  int fb_width_local;
  ImDrawData *draw_data_local;
  
  (*glad_debug_glEnable)(0xbe2);
  (*glad_debug_glBlendEquation)(0x8006);
  (*glad_debug_glBlendFuncSeparate)(0x302,0x303,1,0x303);
  (*glad_debug_glDisable)(0xb44);
  (*glad_debug_glDisable)(0xb71);
  (*glad_debug_glDisable)(0xb90);
  (*glad_debug_glEnable)(0xc11);
  if (0x135 < g_GlVersion) {
    (*glad_debug_glDisable)(0x8f9d);
  }
  (*glad_debug_glPolygonMode)(0x408,0x1b02);
  (*glad_debug_glViewport)(0,0,fb_width,fb_height);
  fVar1 = (draw_data->DisplayPos).x;
  fVar3 = (draw_data->DisplayPos).x + (draw_data->DisplaySize).x;
  fVar2 = (draw_data->DisplayPos).y;
  fVar4 = (draw_data->DisplayPos).y + (draw_data->DisplaySize).y;
  local_78[0] = 2.0 / (fVar3 - fVar1);
  local_78[1] = 0.0;
  ortho_projection[0][0] = 0.0;
  ortho_projection[0][1] = 0.0;
  ortho_projection[0][2] = 0.0;
  ortho_projection[0][3] = 2.0 / (fVar2 - fVar4);
  ortho_projection[1][0] = 0.0;
  ortho_projection[1][1] = 0.0;
  ortho_projection[1][2] = 0.0;
  ortho_projection[1][3] = 0.0;
  ortho_projection[2][0] = -1.0;
  ortho_projection[2][1] = 0.0;
  ortho_projection[2][2] = (fVar3 + fVar1) / (fVar1 - fVar3);
  ortho_projection[2][3] = (fVar2 + fVar4) / (fVar4 - fVar2);
  ortho_projection[3][0] = 0.0;
  ortho_projection[3][1] = 1.0;
  (*glad_debug_glUseProgram)(g_ShaderHandle);
  (*glad_debug_glUniform1i)(g_AttribLocationTex,0);
  (*glad_debug_glUniformMatrix4fv)(g_AttribLocationProjMtx,1,'\0',local_78);
  if (0x149 < g_GlVersion) {
    (*glad_debug_glBindSampler)(0,0);
  }
  (*glad_debug_glBindVertexArray)(vertex_array_object);
  (*glad_debug_glBindBuffer)(0x8892,g_VboHandle);
  (*glad_debug_glBindBuffer)(0x8893,g_ElementsHandle);
  (*glad_debug_glEnableVertexAttribArray)(g_AttribLocationVtxPos);
  (*glad_debug_glEnableVertexAttribArray)(g_AttribLocationVtxUV);
  (*glad_debug_glEnableVertexAttribArray)(g_AttribLocationVtxColor);
  (*glad_debug_glVertexAttribPointer)(g_AttribLocationVtxPos,2,0x1406,'\0',0x14,(void *)0x0);
  (*glad_debug_glVertexAttribPointer)(g_AttribLocationVtxUV,2,0x1406,'\0',0x14,(void *)0x8);
  (*glad_debug_glVertexAttribPointer)(g_AttribLocationVtxColor,4,0x1401,'\x01',0x14,(void *)0x10);
  return;
}

Assistant:

static void ImGui_ImplOpenGL3_SetupRenderState(ImDrawData* draw_data, int fb_width, int fb_height, GLuint vertex_array_object)
{
    // Setup render state: alpha-blending enabled, no face culling, no depth testing, scissor enabled, polygon fill
    glEnable(GL_BLEND);
    glBlendEquation(GL_FUNC_ADD);
    glBlendFuncSeparate(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA, GL_ONE, GL_ONE_MINUS_SRC_ALPHA);
    glDisable(GL_CULL_FACE);
    glDisable(GL_DEPTH_TEST);
    glDisable(GL_STENCIL_TEST);
    glEnable(GL_SCISSOR_TEST);
#ifdef IMGUI_IMPL_OPENGL_MAY_HAVE_PRIMITIVE_RESTART
    if (g_GlVersion >= 310)
        glDisable(GL_PRIMITIVE_RESTART);
#endif
#ifdef GL_POLYGON_MODE
    glPolygonMode(GL_FRONT_AND_BACK, GL_FILL);
#endif

    // Support for GL 4.5 rarely used glClipControl(GL_UPPER_LEFT)
#if defined(GL_CLIP_ORIGIN)
    bool clip_origin_lower_left = true;
    if (g_HasClipOrigin)
    {
        GLenum current_clip_origin = 0; glGetIntegerv(GL_CLIP_ORIGIN, (GLint*)&current_clip_origin);
        if (current_clip_origin == GL_UPPER_LEFT)
            clip_origin_lower_left = false;
    }
#endif

    // Setup viewport, orthographic projection matrix
    // Our visible imgui space lies from draw_data->DisplayPos (top left) to draw_data->DisplayPos+data_data->DisplaySize (bottom right). DisplayPos is (0,0) for single viewport apps.
    glViewport(0, 0, (GLsizei)fb_width, (GLsizei)fb_height);
    float L = draw_data->DisplayPos.x;
    float R = draw_data->DisplayPos.x + draw_data->DisplaySize.x;
    float T = draw_data->DisplayPos.y;
    float B = draw_data->DisplayPos.y + draw_data->DisplaySize.y;
#if defined(GL_CLIP_ORIGIN)
    if (!clip_origin_lower_left) { float tmp = T; T = B; B = tmp; } // Swap top and bottom if origin is upper left
#endif
    const float ortho_projection[4][4] =
    {
        { 2.0f/(R-L),   0.0f,         0.0f,   0.0f },
        { 0.0f,         2.0f/(T-B),   0.0f,   0.0f },
        { 0.0f,         0.0f,        -1.0f,   0.0f },
        { (R+L)/(L-R),  (T+B)/(B-T),  0.0f,   1.0f },
    };
    glUseProgram(g_ShaderHandle);
    glUniform1i(g_AttribLocationTex, 0);
    glUniformMatrix4fv(g_AttribLocationProjMtx, 1, GL_FALSE, &ortho_projection[0][0]);

#ifdef IMGUI_IMPL_OPENGL_MAY_HAVE_BIND_SAMPLER
    if (g_GlVersion >= 330)
        glBindSampler(0, 0); // We use combined texture/sampler state. Applications using GL 3.3 may set that otherwise.
#endif

    (void)vertex_array_object;
#ifndef IMGUI_IMPL_OPENGL_ES2
    glBindVertexArray(vertex_array_object);
#endif

    // Bind vertex/index buffers and setup attributes for ImDrawVert
    glBindBuffer(GL_ARRAY_BUFFER, g_VboHandle);
    glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, g_ElementsHandle);
    glEnableVertexAttribArray(g_AttribLocationVtxPos);
    glEnableVertexAttribArray(g_AttribLocationVtxUV);
    glEnableVertexAttribArray(g_AttribLocationVtxColor);
    glVertexAttribPointer(g_AttribLocationVtxPos,   2, GL_FLOAT,         GL_FALSE, sizeof(ImDrawVert), (GLvoid*)IM_OFFSETOF(ImDrawVert, pos));
    glVertexAttribPointer(g_AttribLocationVtxUV,    2, GL_FLOAT,         GL_FALSE, sizeof(ImDrawVert), (GLvoid*)IM_OFFSETOF(ImDrawVert, uv));
    glVertexAttribPointer(g_AttribLocationVtxColor, 4, GL_UNSIGNED_BYTE, GL_TRUE,  sizeof(ImDrawVert), (GLvoid*)IM_OFFSETOF(ImDrawVert, col));
}